

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O2

MPP_RET __thiscall Mpp::notify(Mpp *this,MppBufferGroup group)

{
  MPP_RET MVar1;
  
  if ((this->mType == MPP_CTX_DEC) && (this->mFrameGroup == group)) {
    MVar1 = notify(this,0x440);
    return MVar1;
  }
  return MPP_NOK;
}

Assistant:

MPP_RET Mpp::notify(MppBufferGroup group)
{
    MPP_RET ret = MPP_NOK;

    switch (mType) {
    case MPP_CTX_DEC : {
        if (group == mFrameGroup)
            ret = notify(MPP_DEC_NOTIFY_BUFFER_VALID |
                         MPP_DEC_NOTIFY_BUFFER_MATCH);
    } break;
    default : {
    } break;
    }

    return ret;
}